

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

void set_default_term(course_query *query)

{
  tm *ptVar1;
  tm *tm;
  time_t now;
  course_query *query_local;
  
  now = (time_t)query;
  tm = (tm *)time((time_t *)0x0);
  ptVar1 = localtime((time_t *)&tm);
  *(short *)(now + 4) = (short)ptVar1->tm_year;
  switch(ptVar1->tm_mon) {
  case 1:
  case 2:
  case 0xc:
    *(undefined4 *)now = 1;
    break;
  case 3:
  case 4:
  case 5:
    *(undefined4 *)now = 2;
    break;
  case 6:
  case 7:
  case 8:
    *(undefined4 *)now = 3;
    break;
  case 9:
  case 10:
  case 0xb:
    *(undefined4 *)now = 0;
  }
  return;
}

Assistant:

void set_default_term(struct course_query *query)
{
	time_t now = time(NULL);
	struct tm *tm = localtime(&now);

	query->year = tm->tm_year;
	switch (tm->tm_mon) {
	case 6:
	case 7:
	case 8:
		/* Summer - June to August */
		query->quarter = SUMMER_QUARTER;
		break;
	case 9:
	case 10:
	case 11:
		/* Fall - September to November */
		query->quarter = FALL_QUARTER;
		break;
	case 12:
	case 1:
	case 2:
		/* Winter - December to February */
		query->quarter = WINTER_QUARTER;
		break;
	case 3:
	case 4:
	case 5:
		/* Spring - March to May */
		query->quarter = SPRING_QUARTER;
	}
}